

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmInfo.cpp
# Opt level: O3

GMM_STATUS __thiscall
GmmLib::GmmMultiAdapterContext::RemoveContext(GmmMultiAdapterContext *this,ADAPTER_BDF sBdf)

{
  int iVar1;
  int iVar2;
  Context *pCVar3;
  GMM_STATUS GVar4;
  GMM_ADAPTER_INFO *pNode;
  bool bVar5;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->MAContextSyncMutex);
  pNode = this->pHeadNode;
  GVar4 = GMM_ERROR;
  while( true ) {
    if (pNode == (GMM_ADAPTER_INFO *)0x0) goto LAB_001b0537;
    pCVar3 = pNode->pGmmLibContext;
    if ((((pCVar3->sBdf).field_0.Data ^ (uint)sBdf.field_0) & 0xffffff) == 0) break;
    pNode = pNode->pNext;
  }
  iVar2 = pCVar3->RefCount;
  if (iVar2 < 1) goto LAB_001b0507;
  do {
    iVar1 = iVar2 + -1;
    LOCK();
    bVar5 = iVar2 == pCVar3->RefCount;
    if (bVar5) {
      pCVar3->RefCount = iVar1;
    }
    UNLOCK();
  } while ((!bVar5) && (iVar2 = pCVar3->RefCount, 0 < iVar2));
  GVar4 = GMM_SUCCESS;
  if (iVar1 == 0) {
    pCVar3 = pNode->pGmmLibContext;
LAB_001b0507:
    Context::DestroyContext(pCVar3);
    pCVar3 = pNode->pGmmLibContext;
    if (pCVar3 != (Context *)0x0) {
      pthread_mutex_destroy((pthread_mutex_t *)&pCVar3->SyncMutex);
      free(pCVar3);
    }
    RemoveAdapterNode(this,pNode);
    GVar4 = GMM_SUCCESS;
  }
LAB_001b0537:
  pthread_mutex_unlock((pthread_mutex_t *)&this->MAContextSyncMutex);
  return GVar4;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmMultiAdapterContext::RemoveContext(ADAPTER_BDF sBdf)
{
    GMM_STATUS SyncLockStatus = LockMAContextSyncMutex();

    if (SyncLockStatus != GMM_SUCCESS)
    {
        return SyncLockStatus;
    }

    GmmLib::GMM_ADAPTER_INFO *pNode = GetAdapterNodeUnlocked(sBdf);
    GMM_LIB_ASSERT(pNode);
    if (!pNode)
    {
        UnLockMAContextSyncMutex();
        return GMM_ERROR;
    }

    if (pNode->pGmmLibContext)
    {
        int32_t ContextRefCount = pNode->pGmmLibContext->DecrementRefCount();
        // Refount = 0, It means that it the last client on this adapter
        // Lets free the LibContext and the Adapter Node
        if (!ContextRefCount)
        {
            pNode->pGmmLibContext->DestroyContext();
            // Delete/free the LibContext object
            delete pNode->pGmmLibContext;

            // Delete/free the AdapterNode from the Linked List
            RemoveAdapterNode(pNode);
            pNode = NULL;
        }
    }
    else
    {
        // No context exists for this node. Just remove it.
        RemoveAdapterNode(pNode);
        pNode = NULL;
    }

    UnLockMAContextSyncMutex();

    return GMM_SUCCESS;
}